

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<unsigned_char,signed_char>(char c,ostream *os)

{
  ostream *poVar1;
  ostream *in_RSI;
  char in_DIL;
  ostream *in_stack_00000008;
  char in_stack_00000013;
  CharFormat format;
  int in_stack_0000015c;
  string local_38 [36];
  CharFormat local_14;
  ostream *local_10;
  char local_1;
  
  local_10 = in_RSI;
  local_1 = in_DIL;
  std::operator<<(in_RSI,"\'");
  local_14 = PrintAsCharLiteralTo<unsigned_char,signed_char>(in_stack_00000013,in_stack_00000008);
  std::operator<<(local_10,"\'");
  if (local_1 != '\0') {
    poVar1 = std::operator<<(local_10," (");
    std::ostream::operator<<(poVar1,(int)local_1);
    if ((local_14 != kHexEscape) && ((local_1 < '\x01' || ('\t' < local_1)))) {
      poVar1 = std::operator<<(local_10,", 0x");
      String::FormatHexInt_abi_cxx11_(in_stack_0000015c);
      std::operator<<(poVar1,local_38);
      std::__cxx11::string::~string(local_38);
    }
    std::operator<<(local_10,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}